

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_65b9::FlexFloatConversionTest_PreservesPrecision_Test::
FlexFloatConversionTest_PreservesPrecision_Test
          (FlexFloatConversionTest_PreservesPrecision_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00172a20;
  return;
}

Assistant:

TEST(FlexFloatConversionTest, PreservesPrecision) {
    #ifdef FLEXFLOAT_ON_SINGLE
    const fp_t val = 1.0f + 1e-5f;
    #endif
    #ifdef FLEXFLOAT_ON_DOUBLE
    const fp_t val = 1.0 + 1e-14;
    #endif
    #ifdef FLEXFLOAT_ON_QUAD
    const fp_t val = 1.0q + 1e-56q;
    #endif
    EXPECT_EQ(val, fp_t(flexfloat<NUM_BITS_EXP, NUM_BITS_FRAC>(val)));
}